

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp
# Opt level: O0

char * __thiscall
glcts::GeometryShaderLayeredRenderingBoundaryConditionNoGS::getVertexShaderCode
          (GeometryShaderLayeredRenderingBoundaryConditionNoGS *this)

{
  GeometryShaderLayeredRenderingBoundaryConditionNoGS *this_local;
  
  return getVertexShaderCode::result;
}

Assistant:

const char* GeometryShaderLayeredRenderingBoundaryConditionNoGS::getVertexShaderCode()
{
	static const char* result = "${VERSION}\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"flat out int layer_id;\n"
								"\n"
								"void main()\n"
								"{\n"
								"    layer_id = 0;\n"
								"\n"
								"    switch (gl_VertexID)\n"
								"    {\n"
								"        case 0:  gl_Position = vec4(-1, -1, 0, 1); break;\n"
								"        case 1:  gl_Position = vec4(-1,  1, 0, 1); break;\n"
								"        case 2:  gl_Position = vec4( 1,  1, 0, 1); break;\n"
								"        default: gl_Position = vec4( 1, -1, 0, 1); break;\n"
								"    }\n"
								"}\n";
	return result;
}